

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[79],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*,char[71],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [79],MemorySizeFormatter<unsigned_long> *RestArgs,
               char (*RestArgs_1) [4],MemorySizeFormatter<unsigned_long> *RestArgs_2,
               char (*RestArgs_3) [3],unsigned_long *RestArgs_4,char **RestArgs_5,
               char (*RestArgs_6) [71],MemorySizeFormatter<unsigned_long> *RestArgs_7,
               char (*RestArgs_8) [4],MemorySizeFormatter<unsigned_long> *RestArgs_9,
               char (*RestArgs_10) [3],unsigned_long *RestArgs_11,char **RestArgs_12)

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*,char[71],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7,RestArgs_8,RestArgs_9,RestArgs_10,RestArgs_11,RestArgs_12);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}